

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

float memory_tree_ns::linear_kernel(flat_example *fec1,flat_example *fec2)

{
  float fVar1;
  ulong uVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  float *pfVar5;
  long in_RSI;
  long in_RDI;
  bool bVar6;
  uint64_t ec2pos;
  uint64_t ec1pos;
  size_t idx2;
  size_t idx1;
  features *fs_2;
  features *fs_1;
  float dotprod;
  undefined8 local_50;
  undefined8 local_40;
  undefined8 local_38;
  undefined4 local_1c;
  undefined4 local_4;
  
  local_1c = 0.0;
  sVar3 = v_array<unsigned_long>::size((v_array<unsigned_long> *)(in_RSI + 0x80));
  if (sVar3 == 0) {
    local_4 = 0.0;
  }
  else {
    local_38 = 0;
    local_40 = 0;
    while( true ) {
      sVar3 = features::size((features *)0x2afb41);
      bVar6 = false;
      if (local_38 < sVar3) {
        sVar3 = features::size((features *)0x2afb68);
        bVar6 = local_40 < sVar3;
      }
      if (!bVar6) break;
      puVar4 = v_array<unsigned_long>::operator[]
                         ((v_array<unsigned_long> *)(in_RDI + 0x80),local_38);
      uVar2 = *puVar4;
      puVar4 = v_array<unsigned_long>::operator[]
                         ((v_array<unsigned_long> *)(in_RSI + 0x80),local_40);
      local_50 = *puVar4;
      if (local_50 <= uVar2) {
        while( true ) {
          bVar6 = false;
          if (local_50 < uVar2) {
            local_40 = local_40 + 1;
            sVar3 = features::size((features *)0x2afbff);
            bVar6 = local_40 < sVar3;
          }
          if (!bVar6) break;
          puVar4 = v_array<unsigned_long>::operator[]
                             ((v_array<unsigned_long> *)(in_RSI + 0x80),local_40);
          local_50 = *puVar4;
        }
        if (uVar2 == local_50) {
          pfVar5 = v_array<float>::operator[]((v_array<float> *)(in_RDI + 0x60),local_38);
          fVar1 = *pfVar5;
          pfVar5 = v_array<float>::operator[]((v_array<float> *)(in_RSI + 0x60),local_40);
          local_1c = fVar1 * *pfVar5 + local_1c;
          local_40 = local_40 + 1;
        }
      }
      local_38 = local_38 + 1;
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

float linear_kernel(const flat_example* fec1, const flat_example* fec2)
    { 
        float dotprod = 0;
   
        features& fs_1 = (features&)fec1->fs;
        features& fs_2 = (features&)fec2->fs;
        if (fs_2.indicies.size() == 0)
            return 0.f;
   
        for (size_t idx1 = 0, idx2 = 0; idx1 < fs_1.size() && idx2 < fs_2.size() ; idx1++)
        { 
            uint64_t ec1pos = fs_1.indicies[idx1];
            uint64_t ec2pos = fs_2.indicies[idx2];
            if(ec1pos < ec2pos) continue;
   
            while(ec1pos > ec2pos && ++idx2 < fs_2.size())
                ec2pos = fs_2.indicies[idx2];
   
            if(ec1pos == ec2pos)
            {
                dotprod += fs_1.values[idx1] * fs_2.values[idx2];
                ++idx2;
            }
        }
        return dotprod;
   }